

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::argument_mode(int *argc,char **argv)

{
  char *__s;
  string_code sVar1;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  string_code local_1c;
  char **ppcStack_18;
  string_code input_arg;
  char **argv_local;
  int *argc_local;
  
  ppcStack_18 = argv;
  argv_local = (char **)argc;
  print_welcome();
  __s = ppcStack_18[1];
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_41);
  sVar1 = ARG_MODE::hashit(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  local_1c = sVar1;
  switch(sVar1) {
  case e3DModel:
    gather_3D_arg((int *)argv_local,ppcStack_18);
    break;
  case eHelp:
    print_help();
    break;
  case eMeshops:
    gather_meshops_arg((int *)argv_local,ppcStack_18);
    break;
  case eModeling:
    gather_modeling_arg((int *)argv_local,ppcStack_18);
    break;
  case eSlice:
    gather_slice_arg((int *)argv_local,ppcStack_18);
    break;
  case eVersion:
    print_version();
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Unrecognized input argument. Try \"-help\" or interactive mode."
               ,&local_79);
    print_ln(&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  return;
}

Assistant:

void UI::argument_mode(int &argc, char *argv[])
{
    print_welcome();
    ARG_MODE::string_code input_arg = ARG_MODE::hashit(argv[1]);
    switch (input_arg)
    {
    case ARG_MODE::eHelp:
        print_help();
        break;
    case ARG_MODE::e3DModel:
        gather_3D_arg(argc,argv);
        break;
    case ARG_MODE::eMeshops:
        gather_meshops_arg(argc, argv);
        break;
    case ARG_MODE::eModeling:
        gather_modeling_arg(argc, argv);
        break;
    case ARG_MODE::eSlice:
        gather_slice_arg(argc, argv);
        break;
    case ARG_MODE::eVersion:
        print_version();
        break;
    default:
        print_ln("Unrecognized input argument. Try \"-help\" or interactive mode.");
        break;
    }
}